

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Unmarshall.c
# Opt level: O2

WJTL_STATUS TestUnmarshallBinary(void)

{
  size_t sVar1;
  JL_STATUS JVar2;
  int iVar3;
  JL_STATUS JVar4;
  JL_STATUS JVar5;
  int iVar6;
  JL_STATUS JVar7;
  JL_STATUS JVar8;
  WJTL_STATUS WVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool Condition;
  size_t errorAtPos;
  size_t local_298;
  uint local_28c;
  uint local_288;
  uint local_284;
  size_t local_280;
  TestStruct theStruct;
  TestStruct2 theStruct2;
  uint8_t zero10 [10];
  JlMarshallElement marshalTestStruct [2];
  JlMarshallElement marshalTestStruct2 [3];
  
  memcpy(marshalTestStruct,&DAT_001417d0,0xc0);
  theStruct.FixedBlob[0] = '\0';
  theStruct.FixedBlob[1] = '\0';
  theStruct.FixedBlob[2] = '\0';
  theStruct.FixedBlob[3] = '\0';
  theStruct.FixedBlob[4] = '\0';
  theStruct.FixedBlob[5] = '\0';
  theStruct.FixedBlob[6] = '\0';
  theStruct.FixedBlob[7] = '\0';
  theStruct.FixedBlob[8] = '\0';
  theStruct.FixedBlob[9] = '\0';
  theStruct._10_6_ = 0;
  theStruct.BinaryBlob2 = 0;
  errorAtPos = 0;
  JVar2 = JlJsonToStruct("{FixedBlob:\'VGhpc0lzVGVzdA\',BinaryBlob2:\'8N68mnhWNBI\'}",
                         marshalTestStruct,2,&theStruct,&errorAtPos);
  WjTestLib_Assert(JVar2 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlJsonToStruct( \"{FixedBlob:\'VGhpc0lzVGVzdA\',BinaryBlob2:\'8N68mnhWNBI\'}\", marshalTestStruct, ( sizeof(marshalTestStruct) / sizeof((marshalTestStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x67b);
  bVar10 = errorAtPos == 0;
  WjTestLib_Assert(bVar10,"0 == errorAtPos",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x67c);
  iVar3 = bcmp(&theStruct,"ThisIsTest",10);
  WjTestLib_Assert(iVar3 == 0,"memcmp( theStruct.FixedBlob, \"ThisIsTest\", 10 ) == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x67e);
  bVar11 = theStruct.BinaryBlob2 == 0x123456789abcdef0;
  WjTestLib_Assert(bVar11,"0x123456789ABCDEF0ULL == theStruct.BinaryBlob2",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x67f);
  JVar4 = JlUnmarshallFreeStructAllocs(marshalTestStruct,2,&theStruct);
  WjTestLib_Assert(JVar4 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlUnmarshallFreeStructAllocs( marshalTestStruct, ( sizeof(marshalTestStruct) / sizeof((marshalTestStruct)[0]) ), &theStruct ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x681);
  memcpy(marshalTestStruct2,&DAT_00141890,0x120);
  theStruct2.VariableBlob3 = (uint32_t *)0x0;
  theStruct2.VariableBlob3Size = 0;
  theStruct2.VariableBlob2 = (void *)0x0;
  theStruct2.VariableBlob2Size = 0;
  theStruct2.VariableBlob1 = (uint8_t *)0x0;
  theStruct2.VariableBlob1Size = 0;
  JVar5 = JlJsonToStruct("{VariableBlob1:\'MTIzNDU2Nzg5MA\',VariableBlob2:\'MTIzNDU2Nzg5MEFBQUFCQkJCQ0NDQ0REREQ\',VariableBlob3:null}"
                         ,marshalTestStruct2,3,&theStruct2,&errorAtPos);
  WjTestLib_Assert(JVar5 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlJsonToStruct( \"{VariableBlob1:\'MTIzNDU2Nzg5MA\',VariableBlob2:\'MTIzNDU2Nzg5MEFBQUFCQkJCQ0NDQ0REREQ\',VariableBlob3:null}\", marshalTestStruct2, ( sizeof(marshalTestStruct2) / sizeof((marshalTestStruct2)[0]) ), &theStruct2, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x699);
  bVar12 = errorAtPos == 0;
  WjTestLib_Assert(bVar12,"0 == errorAtPos",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x69a);
  bVar13 = theStruct2.VariableBlob1 != (uint8_t *)0x0;
  WjTestLib_Assert(bVar13,"(theStruct2.VariableBlob1) != NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x69c);
  local_284 = (uint)((bVar13 && bVar12) &&
                    (bVar10 &&
                    (bVar11 &&
                    (((iVar3 == 0 && JVar2 == JL_STATUS_SUCCESS) && JVar4 == JL_STATUS_SUCCESS) &&
                    JVar5 == JL_STATUS_SUCCESS))));
  bVar10 = theStruct2.VariableBlob1Size == 10;
  WjTestLib_Assert(bVar10,"10 == theStruct2.VariableBlob1Size",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x69d);
  iVar3 = bcmp(theStruct2.VariableBlob1,"1234567890",10);
  WjTestLib_Assert(iVar3 == 0,"memcmp( theStruct2.VariableBlob1, \"1234567890\", 10 ) == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x69e);
  bVar11 = theStruct2.VariableBlob2 != (void *)0x0;
  WjTestLib_Assert(bVar11,"(theStruct2.VariableBlob2) != NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6a0);
  bVar12 = theStruct2.VariableBlob2Size == 0x1a;
  WjTestLib_Assert(bVar12,"26 == theStruct2.VariableBlob2Size",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6a1);
  iVar6 = bcmp(theStruct2.VariableBlob2,"1234567890AAAABBBBCCCCDDDD",0x1a);
  WjTestLib_Assert(iVar6 == 0,
                   "memcmp( theStruct2.VariableBlob2, \"1234567890AAAABBBBCCCCDDDD\", 26 ) == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6a2);
  bVar13 = theStruct2.VariableBlob3 == (uint32_t *)0x0;
  WjTestLib_Assert(bVar13,"(theStruct2.VariableBlob3) == NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6a4);
  bVar14 = theStruct2.VariableBlob3Size == 0;
  WjTestLib_Assert(bVar14,"0 == theStruct2.VariableBlob3Size",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6a5);
  JVar2 = JlJsonToStruct("{VariableBlob1:\'AAAAAAAAAAAAAA\'}",marshalTestStruct2,3,&theStruct2,
                         &errorAtPos);
  WjTestLib_Assert(JVar2 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlJsonToStruct( \"{VariableBlob1:\'AAAAAAAAAAAAAA\'}\", marshalTestStruct2, ( sizeof(marshalTestStruct2) / sizeof((marshalTestStruct2)[0]) ), &theStruct2, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6aa);
  bVar15 = errorAtPos == 0;
  WjTestLib_Assert(bVar15,"0 == errorAtPos",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6ab);
  local_288 = (uint)((bVar15 && JVar2 == JL_STATUS_SUCCESS) &&
                    ((bVar14 && (bVar13 && iVar6 == 0)) &&
                    ((bVar12 && bVar11) && (iVar3 == 0 && bVar10))));
  bVar10 = theStruct2.VariableBlob1Size == 10;
  WjTestLib_Assert(bVar10,"10 == theStruct2.VariableBlob1Size",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6ad);
  zero10[8] = '\0';
  zero10[9] = '\0';
  zero10[0] = '\0';
  zero10[1] = '\0';
  zero10[2] = '\0';
  zero10[3] = '\0';
  zero10[4] = '\0';
  zero10[5] = '\0';
  zero10[6] = '\0';
  zero10[7] = '\0';
  iVar3 = bcmp(theStruct2.VariableBlob1,zero10,10);
  WjTestLib_Assert(iVar3 == 0,"memcmp( theStruct2.VariableBlob1, zero10, 10 ) == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6af);
  bVar11 = theStruct2.VariableBlob2 != (void *)0x0;
  WjTestLib_Assert(bVar11,"(theStruct2.VariableBlob2) != NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6b1);
  bVar12 = theStruct2.VariableBlob2Size == 0x1a;
  WjTestLib_Assert(bVar12,"26 == theStruct2.VariableBlob2Size",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6b2);
  iVar6 = bcmp(theStruct2.VariableBlob2,"1234567890AAAABBBBCCCCDDDD",0x1a);
  WjTestLib_Assert(iVar6 == 0,
                   "memcmp( theStruct2.VariableBlob2, \"1234567890AAAABBBBCCCCDDDD\", 26 ) == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6b3);
  bVar13 = theStruct2.VariableBlob3 == (uint32_t *)0x0;
  WjTestLib_Assert(bVar13,"(theStruct2.VariableBlob3) == NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6b5);
  bVar14 = theStruct2.VariableBlob3Size == 0;
  WjTestLib_Assert(bVar14,"0 == theStruct2.VariableBlob3Size",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6b6);
  JVar2 = JlJsonToStruct("{VariableBlob1:\'MTIzNDU2Nzg5MA\',VariableBlob2:null,VariableBlob3:\'MTIzNDU2Nzg5MA\'}"
                         ,marshalTestStruct2,3,&theStruct2,&errorAtPos);
  WjTestLib_Assert(JVar2 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlJsonToStruct( \"{VariableBlob1:\'MTIzNDU2Nzg5MA\',VariableBlob2:null,VariableBlob3:\'MTIzNDU2Nzg5MA\'}\", marshalTestStruct2, ( sizeof(marshalTestStruct2) / sizeof((marshalTestStruct2)[0]) ), &theStruct2, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6ba);
  bVar15 = errorAtPos == 0;
  WjTestLib_Assert(bVar15,"0 == errorAtPos",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6bb);
  local_28c = (uint)((bVar15 && JVar2 == JL_STATUS_SUCCESS) &&
                    ((bVar14 && (bVar13 && iVar6 == 0)) &&
                    ((bVar12 && bVar11) && (iVar3 == 0 && bVar10))));
  bVar11 = theStruct2.VariableBlob1 != (uint8_t *)0x0;
  WjTestLib_Assert(bVar11,"(theStruct2.VariableBlob1) != NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6bd);
  bVar12 = theStruct2.VariableBlob1Size == 10;
  WjTestLib_Assert(bVar12,"10 == theStruct2.VariableBlob1Size",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6be);
  iVar3 = bcmp(theStruct2.VariableBlob1,"1234567890",10);
  local_298 = CONCAT44(local_298._4_4_,iVar3);
  WjTestLib_Assert(iVar3 == 0,"memcmp( theStruct2.VariableBlob1, \"1234567890\", 10 ) == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6bf);
  bVar13 = theStruct2.VariableBlob2 == (void *)0x0;
  WjTestLib_Assert(bVar13,"(theStruct2.VariableBlob2) == NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6c1);
  bVar14 = theStruct2.VariableBlob2Size == 0;
  WjTestLib_Assert(bVar14,"0 == theStruct2.VariableBlob2Size",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6c2);
  bVar15 = theStruct2.VariableBlob3 != (uint32_t *)0x0;
  WjTestLib_Assert(bVar15,"(theStruct2.VariableBlob3) != NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6c4);
  Condition = theStruct2.VariableBlob3Size == 10;
  WjTestLib_Assert(Condition,"10 == theStruct2.VariableBlob3Size",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6c5);
  iVar3 = bcmp(theStruct2.VariableBlob3,"1234567890",10);
  WjTestLib_Assert(iVar3 == 0,"memcmp( theStruct2.VariableBlob3, \"1234567890\", 10 ) == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6c6);
  JVar2 = JlUnmarshallFreeStructAllocs(marshalTestStruct2,3,&theStruct2);
  WjTestLib_Assert(JVar2 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlUnmarshallFreeStructAllocs( marshalTestStruct2, ( sizeof(marshalTestStruct2) / sizeof((marshalTestStruct2)[0]) ), &theStruct2 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6c8);
  bVar10 = (int)local_298 != 0;
  JVar4 = JlJsonToStruct("{BinaryBlob2:\'8N68mnhWNBI\',FixedBlob:\'c0lzVGVzdA\'}",marshalTestStruct,
                         2,&theStruct,&errorAtPos);
  WjTestLib_Assert(JVar4 == JL_STATUS_INVALID_DATA,
                   "(JlJsonToStruct( \"{BinaryBlob2:\'8N68mnhWNBI\',FixedBlob:\'c0lzVGVzdA\'}\", marshalTestStruct, ( sizeof(marshalTestStruct) / sizeof((marshalTestStruct)[0]) ), &theStruct, &errorAtPos )) == (JL_STATUS_INVALID_DATA)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6cd);
  local_298 = errorAtPos;
  WjTestLib_Assert(errorAtPos == 0x25,"37 == errorAtPos",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6ce);
  JVar5 = JlJsonToStruct("{BinaryBlob2:\'8N68mnhWNBI\',FixedBlob:\'VGhpVGhpc0lzVGVzdA\'}",
                         marshalTestStruct,2,&theStruct,&errorAtPos);
  WjTestLib_Assert(JVar5 == JL_STATUS_INVALID_DATA,
                   "(JlJsonToStruct( \"{BinaryBlob2:\'8N68mnhWNBI\',FixedBlob:\'VGhpVGhpc0lzVGVzdA\'}\", marshalTestStruct, ( sizeof(marshalTestStruct) / sizeof((marshalTestStruct)[0]) ), &theStruct, &errorAtPos )) == (JL_STATUS_INVALID_DATA)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6d3);
  local_280 = errorAtPos;
  WjTestLib_Assert(errorAtPos == 0x25,"37 == errorAtPos",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6d4);
  JVar7 = JlJsonToStruct("{BinaryBlob2:\'8N68mnhWNBI\',FixedBlob:\'VGhp%0lzVGVzdA\'}",
                         marshalTestStruct,2,&theStruct,&errorAtPos);
  WjTestLib_Assert(JVar7 == JL_STATUS_INVALID_DATA,
                   "(JlJsonToStruct( \"{BinaryBlob2:\'8N68mnhWNBI\',FixedBlob:\'VGhp%0lzVGVzdA\'}\", marshalTestStruct, ( sizeof(marshalTestStruct) / sizeof((marshalTestStruct)[0]) ), &theStruct, &errorAtPos )) == (JL_STATUS_INVALID_DATA)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6d9);
  sVar1 = errorAtPos;
  WjTestLib_Assert(errorAtPos == 0x25,"37 == errorAtPos",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6da);
  JVar8 = JlJsonToStruct("{FixedBlob:\'VGhpc0lzVGVzdA===\',BinaryBlob2:\'8N68mnhWNBI==Anything ignored after padding\'}"
                         ,marshalTestStruct,2,&theStruct,&errorAtPos);
  WjTestLib_Assert(JVar8 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlJsonToStruct( \"{FixedBlob:\'VGhpc0lzVGVzdA===\',BinaryBlob2:\'8N68mnhWNBI==Anything ignored after padding\'}\", marshalTestStruct, ( sizeof(marshalTestStruct) / sizeof((marshalTestStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6df);
  WVar9 = WJTL_STATUS_SUCCESS;
  if ((local_284 & 1) == 0) {
    WVar9 = WJTL_STATUS_FAILED;
  }
  if ((local_288 & 1) == 0) {
    WVar9 = WJTL_STATUS_FAILED;
  }
  if ((local_28c & 1) == 0) {
    WVar9 = WJTL_STATUS_FAILED;
  }
  if (!Condition ||
      ((!bVar15 || (!bVar14 || !bVar13)) ||
      ((!bVar12 || !bVar11) || ((iVar3 != 0 || bVar10) || JVar2 != JL_STATUS_SUCCESS)))) {
    WVar9 = WJTL_STATUS_FAILED;
  }
  if (errorAtPos != 0) {
    WVar9 = WJTL_STATUS_FAILED;
  }
  if (JVar8 != JL_STATUS_SUCCESS) {
    WVar9 = WJTL_STATUS_FAILED;
  }
  if (sVar1 != 0x25) {
    WVar9 = WJTL_STATUS_FAILED;
  }
  if (JVar7 != JL_STATUS_INVALID_DATA) {
    WVar9 = WJTL_STATUS_FAILED;
  }
  if (local_280 != 0x25) {
    WVar9 = WJTL_STATUS_FAILED;
  }
  if (JVar5 != JL_STATUS_INVALID_DATA) {
    WVar9 = WJTL_STATUS_FAILED;
  }
  if (local_298 != 0x25) {
    WVar9 = WJTL_STATUS_FAILED;
  }
  if (JVar4 != JL_STATUS_INVALID_DATA) {
    WVar9 = WJTL_STATUS_FAILED;
  }
  WjTestLib_Assert(errorAtPos == 0,"0 == errorAtPos",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6e0);
  return WVar9;
}

Assistant:

static
WJTL_STATUS
    TestUnmarshallBinary
    (
        void
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;

    typedef struct
    {
        uint8_t     FixedBlob[10];      // Treat as 80bit binary
        uint64_t    BinaryBlob2;        // Treat as 64bit binary
    } TestStruct;

    JlMarshallElement marshalTestStruct[] =
    {
        JlMarshallBinaryFixed( TestStruct, FixedBlob, "FixedBlob" ),
        JlMarshallBinaryFixed( TestStruct, BinaryBlob2, "BinaryBlob2" ),
    };

    TestStruct theStruct = {{0}};
    size_t errorAtPos = 0;

    // Test success
    JL_ASSERT_SUCCESS( JlJsonToStruct(
        "{FixedBlob:'VGhpc0lzVGVzdA',BinaryBlob2:'8N68mnhWNBI'}",
        marshalTestStruct, NumElements(marshalTestStruct), &theStruct, &errorAtPos ) );
    JL_ASSERT( 0 == errorAtPos );

    JL_ASSERT( memcmp( theStruct.FixedBlob, "ThisIsTest", 10 ) == 0 );
    JL_ASSERT( 0x123456789ABCDEF0ULL == theStruct.BinaryBlob2 );

    JL_ASSERT_SUCCESS( JlUnmarshallFreeStructAllocs( marshalTestStruct, NumElements(marshalTestStruct), &theStruct ) );

    // Now Test with variable sized binary
    typedef struct
    {
        uint8_t*    VariableBlob1;
        size_t      VariableBlob1Size;
        void*       VariableBlob2;
        size_t      VariableBlob2Size;
        uint32_t*   VariableBlob3;
        size_t      VariableBlob3Size;
    } TestStruct2;

    JlMarshallElement marshalTestStruct2[] =
    {
        JlMarshallBinary( TestStruct2, VariableBlob1, VariableBlob1Size, "VariableBlob1" ),
        JlMarshallBinary( TestStruct2, VariableBlob2, VariableBlob2Size, "VariableBlob2" ),
        JlMarshallBinary( TestStruct2, VariableBlob3, VariableBlob3Size, "VariableBlob3" ),
    };

    TestStruct2 theStruct2 = {0};

    JL_ASSERT_SUCCESS( JlJsonToStruct(
        "{VariableBlob1:'MTIzNDU2Nzg5MA',VariableBlob2:'MTIzNDU2Nzg5MEFBQUFCQkJCQ0NDQ0REREQ',VariableBlob3:null}",
        marshalTestStruct2, NumElements(marshalTestStruct2), &theStruct2, &errorAtPos ) );
    JL_ASSERT( 0 == errorAtPos );

    JL_ASSERT_NOT_NULL( theStruct2.VariableBlob1 );
    JL_ASSERT( 10 == theStruct2.VariableBlob1Size );
    JL_ASSERT( memcmp( theStruct2.VariableBlob1, "1234567890", 10 ) == 0 );

    JL_ASSERT_NOT_NULL( theStruct2.VariableBlob2 );
    JL_ASSERT( 26 == theStruct2.VariableBlob2Size );
    JL_ASSERT( memcmp( theStruct2.VariableBlob2, "1234567890AAAABBBBCCCCDDDD", 26 ) == 0 );

    JL_ASSERT_NULL( theStruct2.VariableBlob3 );
    JL_ASSERT( 0 == theStruct2.VariableBlob3Size );

    // Now test loading in different data and making sure no memory leak
    JL_ASSERT_SUCCESS( JlJsonToStruct(
        "{VariableBlob1:'AAAAAAAAAAAAAA'}",
        marshalTestStruct2, NumElements(marshalTestStruct2), &theStruct2, &errorAtPos ) );
    JL_ASSERT( 0 == errorAtPos );

    JL_ASSERT( 10 == theStruct2.VariableBlob1Size );
    uint8_t zero10[10] = {0};
    JL_ASSERT( memcmp( theStruct2.VariableBlob1, zero10, 10 ) == 0 );

    JL_ASSERT_NOT_NULL( theStruct2.VariableBlob2 );
    JL_ASSERT( 26 == theStruct2.VariableBlob2Size );
    JL_ASSERT( memcmp( theStruct2.VariableBlob2, "1234567890AAAABBBBCCCCDDDD", 26 ) == 0 );

    JL_ASSERT_NULL( theStruct2.VariableBlob3 );
    JL_ASSERT( 0 == theStruct2.VariableBlob3Size );

    JL_ASSERT_SUCCESS( JlJsonToStruct(
        "{VariableBlob1:'MTIzNDU2Nzg5MA',VariableBlob2:null,VariableBlob3:'MTIzNDU2Nzg5MA'}",
        marshalTestStruct2, NumElements(marshalTestStruct2), &theStruct2, &errorAtPos ) );
    JL_ASSERT( 0 == errorAtPos );

    JL_ASSERT_NOT_NULL( theStruct2.VariableBlob1 );
    JL_ASSERT( 10 == theStruct2.VariableBlob1Size );
    JL_ASSERT( memcmp( theStruct2.VariableBlob1, "1234567890", 10 ) == 0 );

    JL_ASSERT_NULL( theStruct2.VariableBlob2 );
    JL_ASSERT( 0 == theStruct2.VariableBlob2Size );

    JL_ASSERT_NOT_NULL( theStruct2.VariableBlob3 );
    JL_ASSERT( 10 == theStruct2.VariableBlob3Size );
    JL_ASSERT( memcmp( theStruct2.VariableBlob3, "1234567890", 10 ) == 0 );

    JL_ASSERT_SUCCESS( JlUnmarshallFreeStructAllocs( marshalTestStruct2, NumElements(marshalTestStruct2), &theStruct2 ) );

    // Now test invalid values. Fixed buffers have to have the exact sized base 64
    JL_ASSERT_STATUS( JlJsonToStruct(
        "{BinaryBlob2:'8N68mnhWNBI',FixedBlob:'c0lzVGVzdA'}",
        marshalTestStruct, NumElements(marshalTestStruct), &theStruct, &errorAtPos ), JL_STATUS_INVALID_DATA );
    JL_ASSERT( 37 == errorAtPos );

    // Now test invalid values. Fixed buffers have to have the exact sized base 64
    JL_ASSERT_STATUS( JlJsonToStruct(
        "{BinaryBlob2:'8N68mnhWNBI',FixedBlob:'VGhpVGhpc0lzVGVzdA'}",
        marshalTestStruct, NumElements(marshalTestStruct), &theStruct, &errorAtPos ), JL_STATUS_INVALID_DATA );
    JL_ASSERT( 37 == errorAtPos );

    // Now test invalid base 64
    JL_ASSERT_STATUS( JlJsonToStruct(
        "{BinaryBlob2:'8N68mnhWNBI',FixedBlob:'VGhp%0lzVGVzdA'}",
        marshalTestStruct, NumElements(marshalTestStruct), &theStruct, &errorAtPos ), JL_STATUS_INVALID_DATA );
    JL_ASSERT( 37 == errorAtPos );

    // Now test padding character
    JL_ASSERT_SUCCESS( JlJsonToStruct(
        "{FixedBlob:'VGhpc0lzVGVzdA===',BinaryBlob2:'8N68mnhWNBI==Anything ignored after padding'}",
        marshalTestStruct, NumElements(marshalTestStruct), &theStruct, &errorAtPos ) );
    JL_ASSERT( 0 == errorAtPos );

    return TestReturn;
}